

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::TestCaseInfo::addFilenameTag(TestCaseInfo *this)

{
  anon_unknown_26 *this_00;
  char *pcVar1;
  size_type extraout_RDX;
  StringRef SVar2;
  string combined;
  allocator<char> local_39;
  StringRef local_38 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"#",&local_39);
  this_00 = (anon_unknown_26 *)(this->lineInfo).file;
  pcVar1 = (char *)strlen((char *)this_00);
  SVar2.m_size = extraout_RDX;
  SVar2.m_start = pcVar1;
  SVar2 = anon_unknown_26::extractFilenamePart(this_00,SVar2);
  std::__cxx11::string::append((char *)local_38,(ulong)SVar2.m_start);
  internalAppendTag(this,local_38[0]);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void TestCaseInfo::addFilenameTag() {
        std::string combined("#");
        combined += extractFilenamePart(lineInfo.file);
        internalAppendTag(combined);
    }